

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall
deqp::gls::anon_unknown_1::DrawTestShaderProgram::shadeVertices
          (DrawTestShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  GenericVecType GVar2;
  VertexPacket *pVVar3;
  float fVar4;
  int i;
  UniformSlot *pUVar5;
  pointer pGVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  uint uVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar20;
  undefined1 auVar19 [16];
  Vector<float,_3> res;
  undefined8 local_c8;
  float local_c0;
  Vec4 local_b8;
  undefined8 local_a8;
  float local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_70;
  VertexPacket **local_68;
  ulong local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_68 = packets;
  pUVar5 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  local_88 = *(undefined8 *)&pUVar5->value;
  uStack_80 = *(undefined8 *)((long)&pUVar5->value + 8);
  pUVar5 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  if (0 < numPackets) {
    local_58 = (pUVar5->value).f;
    local_48 = ZEXT416((uint)local_58);
    local_70 = (ulong)(uint)numPackets;
    local_88 = CONCAT44((float)local_88,(float)local_88);
    uStack_80 = CONCAT44((float)local_88,(float)local_88);
    local_60 = 0;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      local_c8._4_4_ = 1.0;
      local_c8._0_4_ = 1.0;
      pVVar3 = local_68[local_60];
      local_c8 = 0x3f8000003f800000;
      local_c0 = 1.0;
      pGVar6 = (this->m_attrType).
               super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_98 = 0.0;
      fStack_94 = 0.0;
      fStack_90 = 0.0;
      fStack_8c = 0.0;
      fVar10 = 1.0;
      if (0 < (int)((ulong)((long)(this->m_attrType).
                                  super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar6) >> 2))
      {
        uVar9 = 0;
        do {
          iVar1 = (this->m_componentCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
          uVar8 = 1L << ((byte)uVar9 & 0x3f) &
                  (this->m_isCoord).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [uVar9 >> 6 & 0x3ffffff];
          GVar2 = pGVar6[uVar9];
          if (GVar2 != GENERICVECTYPE_INT32) {
            if (GVar2 == GENERICVECTYPE_UINT32) {
              local_b8.m_data[0] = 0.0;
              local_b8.m_data[1] = 0.0;
              local_b8.m_data[2] = 0.0;
              local_b8.m_data[3] = 0.0;
              rr::readVertexAttrib
                        ((UVec4 *)&local_b8,inputs + uVar9,pVVar3->instanceNdx,pVVar3->vertexNdx);
              uVar14 = local_b8.m_data[1];
              dVar18 = (double)DAT_009ce3d0;
              dVar20 = DAT_009ce3d0._8_8_;
              if (uVar8 != 0) {
                switch(iVar1 + -1) {
                case 0:
                  local_b8.m_data[0] = (float)(local_b8.m_data._0_8_ & 0xffffffff);
                  local_b8.m_data[1] = local_b8.m_data[0];
                  fVar10 = local_b8.m_data[0];
                  break;
                case 1:
                  auVar13._0_8_ = local_b8.m_data._0_8_ & 0xffffffff;
                  auVar13._8_4_ = uVar14;
                  auVar13._12_4_ = 0;
                  local_b8.m_data[0] = (float)(SUB168(auVar13 | _DAT_009ce3d0,0) - dVar18);
                  local_b8.m_data[1] = (float)(SUB168(auVar13 | _DAT_009ce3d0,8) - dVar20);
                  fVar10 = 0.0;
                  break;
                case 2:
                  fVar10 = (float)(local_b8.m_data._0_8_ & 0xffffffff);
                  local_b8.m_data[2] = (float)(local_b8.m_data._8_8_ & 0xffffffff);
                  local_b8.m_data[3] = (float)uVar14;
                  goto LAB_007ffad2;
                case 3:
                  auVar12._0_8_ = local_b8.m_data._0_8_ & 0xffffffff;
                  auVar12._8_4_ = uVar14;
                  auVar12._12_4_ = 0;
                  local_b8.m_data[0] = (float)(SUB168(auVar12 | _DAT_009ce3d0,0) - dVar18);
                  local_b8.m_data[1] = (float)(SUB168(auVar12 | _DAT_009ce3d0,8) - dVar20);
                  auVar15._0_8_ = local_b8.m_data._8_8_ & 0xffffffff;
                  auVar15._8_4_ = local_b8.m_data[3];
                  auVar15._12_4_ = 0;
                  local_b8.m_data[2] = (float)(SUB168(auVar15 | _DAT_009ce3d0,0) - dVar18);
                  local_b8.m_data[3] = (float)(SUB168(auVar15 | _DAT_009ce3d0,8) - dVar20);
                  goto LAB_007ffb35;
                default:
                  goto switchD_007ff869_default;
                }
                goto LAB_007ffb51;
              }
              switch(iVar1 + -1) {
              case 0:
                local_a8 = 0;
                local_a0 = 0.0;
                lVar7 = 0;
                do {
                  *(float *)((long)&local_a8 + lVar7 * 4) =
                       *(float *)((long)&local_c8 + lVar7 * 4) *
                       (float)(local_b8.m_data._0_8_ & 0xffffffff);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 3);
                goto LAB_007ffa43;
              case 1:
                auVar17._0_8_ = local_b8.m_data._0_8_ & 0xffffffff;
                auVar17._8_4_ = uVar14;
                auVar17._12_4_ = 0;
                local_b8.m_data[0] = (float)(SUB168(auVar17 | _DAT_009ce3d0,0) - dVar18);
                local_b8.m_data[1] = (float)(SUB168(auVar17 | _DAT_009ce3d0,8) - dVar20);
                goto LAB_007ffce9;
              case 2:
                auVar16._0_8_ = local_b8.m_data._0_8_ & 0xffffffff;
                auVar16._8_4_ = uVar14;
                auVar16._12_4_ = 0;
                local_c8 = CONCAT44((float)(SUB168(auVar16 | _DAT_009ce3d0,8) - dVar20) *
                                    local_c8._4_4_,
                                    (float)(SUB168(auVar16 | _DAT_009ce3d0,0) - dVar18) *
                                    (float)local_c8);
                fVar10 = (float)(local_b8.m_data._8_8_ & 0xffffffff);
                goto LAB_007ffbfd;
              case 3:
                fVar11 = (float)(uint)local_b8.m_data[3];
                auVar19._0_8_ = local_b8.m_data._0_8_ & 0xffffffff;
                auVar19._8_4_ = uVar14;
                auVar19._12_4_ = 0;
                local_c8 = CONCAT44(fVar11 * (float)(SUB168(auVar19 | _DAT_009ce3d0,8) - dVar20) *
                                             local_c8._4_4_,
                                    fVar11 * (float)(SUB168(auVar19 | _DAT_009ce3d0,0) - dVar18) *
                                             (float)local_c8);
                fVar10 = (float)(local_b8.m_data._8_8_ & 0xffffffff);
                goto LAB_007ffc8d;
              }
            }
            else if (GVar2 == GENERICVECTYPE_FLOAT) {
              local_b8.m_data[0] = 0.0;
              local_b8.m_data[1] = 0.0;
              local_b8.m_data[2] = 0.0;
              local_b8.m_data[3] = 0.0;
              rr::readVertexAttrib(&local_b8,inputs + uVar9,pVVar3->instanceNdx,pVVar3->vertexNdx);
              if (uVar8 != 0) {
                switch(iVar1 + -1) {
                case 0:
                  local_b8.m_data[1] = local_b8.m_data[0];
                  fVar10 = local_b8.m_data[0];
                  break;
                case 1:
                  fVar10 = 0.0;
                  break;
                case 2:
                  local_b8.m_data[0] = local_b8.m_data[0] + local_b8.m_data[2];
                  fVar10 = 0.0;
                  break;
                case 3:
                  goto LAB_007ffb35;
                default:
                  goto switchD_007ff869_default;
                }
                goto LAB_007ffb51;
              }
              switch(iVar1 + -1) {
              case 0:
                local_a8 = 0;
                local_a0 = 0.0;
                lVar7 = 0;
                do {
                  *(float *)((long)&local_a8 + lVar7 * 4) =
                       *(float *)((long)&local_c8 + lVar7 * 4) * local_b8.m_data[0];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 3);
                goto LAB_007ffa43;
              case 1:
                goto LAB_007ffce9;
              case 2:
                local_c8 = CONCAT44(local_b8.m_data[1] * local_c8._4_4_,
                                    local_b8.m_data[0] * (float)local_c8);
                local_c0 = local_c0 * local_b8.m_data[2];
                break;
              case 3:
                local_c8 = CONCAT44(local_b8.m_data[3] * local_b8.m_data[1] * local_c8._4_4_,
                                    local_b8.m_data[3] * local_b8.m_data[0] * (float)local_c8);
                local_c0 = local_c0 * local_b8.m_data[2];
                fVar11 = local_b8.m_data[3];
                goto LAB_007ffcd2;
              }
            }
            goto switchD_007ff869_default;
          }
          local_b8.m_data[0] = 0.0;
          local_b8.m_data[1] = 0.0;
          local_b8.m_data[2] = 0.0;
          local_b8.m_data[3] = 0.0;
          rr::readVertexAttrib
                    ((IVec4 *)&local_b8,inputs + uVar9,pVVar3->instanceNdx,pVVar3->vertexNdx);
          fVar4 = local_b8.m_data[1];
          if (uVar8 == 0) {
            switch(iVar1 + -1) {
            case 0:
              local_a8 = 0;
              local_a0 = 0.0;
              lVar7 = 0;
              do {
                *(float *)((long)&local_a8 + lVar7 * 4) =
                     *(float *)((long)&local_c8 + lVar7 * 4) * (float)(int)local_b8.m_data[0];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
LAB_007ffa43:
              local_c0 = local_a0;
              local_c8 = local_a8;
              break;
            case 1:
              local_b8.m_data[0] = (float)(int)local_b8.m_data[0];
              local_b8.m_data[1] = (float)(int)fVar4;
LAB_007ffce9:
              local_c8 = CONCAT44(local_b8.m_data[1] * local_c8._4_4_,
                                  local_b8.m_data[0] * (float)local_c8);
              break;
            case 2:
              local_c8 = CONCAT44((float)(int)fVar4 * local_c8._4_4_,
                                  (float)(int)local_b8.m_data[0] * (float)local_c8);
              fVar10 = (float)(int)local_b8.m_data[2];
LAB_007ffbfd:
              local_c0 = fVar10 * local_c0;
              break;
            case 3:
              fVar11 = (float)(int)local_b8.m_data[3];
              local_c8 = CONCAT44(fVar11 * (float)(int)fVar4 * local_c8._4_4_,
                                  fVar11 * (float)(int)local_b8.m_data[0] * (float)local_c8);
              fVar10 = (float)(int)local_b8.m_data[2];
LAB_007ffc8d:
              local_c0 = fVar10 * local_c0;
LAB_007ffcd2:
              local_c0 = local_c0 * fVar11;
            }
            goto switchD_007ff869_default;
          }
          switch(iVar1 + -1) {
          case 0:
            local_b8.m_data[0] = (float)(int)local_b8.m_data[0];
            local_b8.m_data[1] = local_b8.m_data[0];
            fVar10 = local_b8.m_data[0];
            break;
          case 1:
            local_b8.m_data[0] = (float)(int)local_b8.m_data[0];
            local_b8.m_data[1] = (float)(int)fVar4;
            fVar10 = 0.0;
            break;
          case 2:
            fVar10 = (float)(int)local_b8.m_data[0];
            local_b8.m_data[2] = (float)(int)local_b8.m_data[2];
            local_b8.m_data[3] = (float)(int)fVar4;
LAB_007ffad2:
            local_b8.m_data[2] = local_b8.m_data[2] + fVar10;
            goto LAB_007ffb38;
          case 3:
            local_b8.m_data[0] = (float)(int)local_b8.m_data[0];
            local_b8.m_data[1] = (float)(int)fVar4;
            local_b8.m_data[2] = (float)(int)local_b8.m_data[2];
            local_b8.m_data[3] = (float)(int)local_b8.m_data[3];
LAB_007ffb35:
            local_b8.m_data[2] = local_b8.m_data[2] + local_b8.m_data[0];
            local_b8.m_data[3] = local_b8.m_data[3] + local_b8.m_data[1];
LAB_007ffb38:
            local_98 = local_98 + local_b8.m_data[2];
            fStack_94 = fStack_94 + local_b8.m_data[3];
            fStack_90 = fStack_90 + 0.0;
            fStack_8c = fStack_8c + 0.0;
          default:
            goto switchD_007ff869_default;
          }
LAB_007ffb51:
          local_98 = local_98 + local_b8.m_data[0];
          fStack_94 = fStack_94 + local_b8.m_data[1];
          fStack_90 = fStack_90 + fVar10;
          fStack_8c = fStack_8c + fVar10;
switchD_007ff869_default:
          uVar9 = uVar9 + 1;
          pGVar6 = (this->m_attrType).
                   super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while ((long)uVar9 <
                 (long)(int)((ulong)((long)(this->m_attrType).
                                           super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar6
                                    ) >> 2));
        fVar10 = local_c0;
      }
      (pVVar3->position).m_data[0] = local_98 * (float)local_88;
      (pVVar3->position).m_data[1] = fStack_94 * local_88._4_4_;
      (pVVar3->position).m_data[2] = 1.0;
      (pVVar3->position).m_data[3] = 1.0;
      pVVar3->pointSize = 1.0;
      pVVar3->outputs[0].v.fData[0] = (float)local_c8 * local_58 * 0.5 + 0.5;
      pVVar3->outputs[0].v.fData[1] = local_c8._4_4_ * fStack_54 * 0.5 + 0.5;
      pVVar3->outputs[0].v.fData[2] = fVar10 * (float)local_48._0_4_ * 0.5 + 0.5;
      pVVar3->outputs[0].v.uData[3] = 0x3f800000;
      local_60 = local_60 + 1;
    } while (local_60 != local_70);
  }
  return;
}

Assistant:

void DrawTestShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(0.0, 0.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int	numComponents	= m_componentCount[attribNdx];
			const bool	isCoord			= m_isCoord[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
			packet.pointSize = 1.0f;
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f) * 0.5f + tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
		}
	}
}